

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O0

void __thiscall HAXX_UNARY_OP::real_unary_sub::test_method(real_unary_sub *this)

{
  undefined8 uVar1;
  bool bVar2;
  double x;
  quaternion<double> q;
  basic_cstring<const_char> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  undefined1 local_1e0 [40];
  undefined1 local_1b8 [16];
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  undefined1 local_178 [40];
  undefined1 local_150 [16];
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  undefined1 local_110 [40];
  undefined1 local_e8 [16];
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8 [2];
  basic_cstring<const_char> local_a8;
  undefined1 local_98 [40];
  undefined1 local_70 [16];
  basic_cstring<const_char> local_60;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  local_50 = -4.59;
  HAXX::quaternion<double>::operator-=(&local_28,&local_50);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x37,local_70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_c8[0].m_end = (iterator)HAXX::quaternion<double>::real(&local_28);
    local_c8[0].m_begin = (iterator)(1.0 - local_50);
    in_stack_fffffffffffffd38 = "1. - (x)";
    in_stack_fffffffffffffd30 = local_c8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_98,&local_a8,0x37,1,2,&local_c8[0].m_end,"q.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a8720);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x38,local_e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_130.m_end = (iterator)HAXX::quaternion<double>::imag_i(&local_28);
    local_130.m_begin = (iterator)0x4000000000000000;
    in_stack_fffffffffffffd38 = "2.";
    in_stack_fffffffffffffd30 = &local_130;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_110,&local_120,0x38,1,2,&local_130.m_end,"q.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a8877);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_140,0x39,local_150);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_198.m_end = (iterator)HAXX::quaternion<double>::imag_j(&local_28);
    local_198.m_begin = (iterator)0x4008000000000000;
    in_stack_fffffffffffffd38 = "3.";
    in_stack_fffffffffffffd30 = &local_198;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_178,&local_188,0x39,1,2,&local_198.m_end,"q.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a89b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a8,0x3a,local_1b8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_200.m_end = (iterator)HAXX::quaternion<double>::imag_k(&local_28);
    local_200.m_begin = (iterator)0x4010000000000000;
    in_stack_fffffffffffffd38 = "4.";
    in_stack_fffffffffffffd30 = &local_200;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_1e0,&local_1f0,0x3a,1,2,&local_200.m_end,"q.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1a8ae9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(real_unary_sub)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.);
  double x = -4.59;
  q -= x;

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),1. - (x));
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);

}